

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  bool bVar1;
  int iVar2;
  int v1;
  string *psVar3;
  int in_EDI;
  MutexLock l;
  CheckOpString _result_1;
  CheckOpString _result;
  Mutex *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  LogSeverity in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  LogMessageData *in_stack_ffffffffffffffc0;
  CheckOpString local_30;
  LogMessage local_28;
  CheckOpString local_18 [2];
  int local_4;
  
  local_4 = in_EDI;
  iVar2 = GetReferenceableValue(in_EDI);
  GetReferenceableValue(0);
  psVar3 = Check_GEImpl_abi_cxx11_
                     (in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                      (char *)in_stack_ffffffffffffff98);
  CheckOpString::CheckOpString(local_18,psVar3);
  bVar1 = CheckOpString::operator_cast_to_bool(local_18);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (char *)CONCAT44(in_stack_ffffffffffffffac,iVar2),in_stack_ffffffffffffffa4,
               (CheckOpString *)in_stack_ffffffffffffff98);
    LogMessage::stream(&local_28);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)0x12ba2f);
  }
  v1 = GetReferenceableValue(local_4);
  GetReferenceableValue(4);
  psVar3 = Check_LTImpl_abi_cxx11_(v1,in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  CheckOpString::CheckOpString(&local_30,psVar3);
  bVar1 = CheckOpString::operator_cast_to_bool(&local_30);
  if (!bVar1) {
    ::glog_internal_namespace_::MutexLock::MutexLock
              ((MutexLock *)CONCAT44(v1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    log_destination(in_stack_ffffffffffffffb4);
    anon_unknown_10::LogFileObject::SetSymlinkBasename
              ((LogFileObject *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ::glog_internal_namespace_::MutexLock::~MutexLock((MutexLock *)0x12bae0);
    return;
  }
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             (char *)CONCAT44(in_stack_ffffffffffffffac,iVar2),v1,
             (CheckOpString *)in_stack_ffffffffffffff98);
  LogMessage::stream((LogMessage *)&stack0xffffffffffffffc0);
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)0x12baa6);
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}